

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O2

SOCKET http_Connect(uri_type *destination_url,uri_type *url)

{
  socklen_t addrlen;
  int sockfd;
  int iVar1;
  int *piVar2;
  sockaddr_storage *serv_addr;
  char errorBuffer [256];
  
  http_FixUrl(destination_url,url);
  sockfd = socket((uint)(url->hostport).IPaddress.ss_family,1,0);
  if (sockfd == -1) {
    sockfd = -0xcd;
  }
  else {
    serv_addr = &(url->hostport).IPaddress;
    addrlen = 0x10;
    if (serv_addr->ss_family == 10) {
      addrlen = 0x1c;
    }
    iVar1 = private_connect(sockfd,(sockaddr *)serv_addr,addrlen);
    if (iVar1 == -1) {
      iVar1 = shutdown(sockfd,2);
      if (iVar1 == -1) {
        piVar2 = __errno_location();
        __xpg_strerror_r(*piVar2,errorBuffer,0x100);
        UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x14f,
                   "Error in shutdown: %s\n",errorBuffer);
      }
      close(sockfd);
      sockfd = -0xcc;
    }
  }
  return sockfd;
}

Assistant:

SOCKET http_Connect(uri_type *destination_url, uri_type *url)
{
	SOCKET connfd;
	socklen_t sockaddr_len;
	int ret_connect;
	char errorBuffer[ERROR_BUFFER_LEN];

	http_FixUrl(destination_url, url);

	connfd = socket((int)url->hostport.IPaddress.ss_family, SOCK_STREAM, 0);
	if (connfd == INVALID_SOCKET) {
		return (SOCKET)(UPNP_E_OUTOF_SOCKET);
	}
	sockaddr_len = (socklen_t)(url->hostport.IPaddress.ss_family == AF_INET6
					   ? sizeof(struct sockaddr_in6)
					   : sizeof(struct sockaddr_in));
	ret_connect = private_connect(connfd,
		(struct sockaddr *)&url->hostport.IPaddress,
		sockaddr_len);
	if (ret_connect == -1) {
#ifdef _WIN32
		UpnpPrintf(UPNP_CRITICAL,
			HTTP,
			__FILE__,
			__LINE__,
			"connect error: %d\n",
			WSAGetLastError());
#endif
		if (shutdown(connfd, SD_BOTH) == -1) {
			strerror_r(errno, errorBuffer, ERROR_BUFFER_LEN);
			UpnpPrintf(UPNP_INFO,
				HTTP,
				__FILE__,
				__LINE__,
				"Error in shutdown: %s\n",
				errorBuffer);
		}
		UpnpCloseSocket(connfd);
		return (SOCKET)(UPNP_E_SOCKET_CONNECT);
	}

	return connfd;
}